

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void spill_restore_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,MIR_reg_t base_reg,MIR_insn_t anchor,
                      int after_p,int restore_p)

{
  MIR_type_t type_00;
  MIR_op_mode_t data_mode_00;
  MIR_reg_t hard_reg_00;
  char *pcVar1;
  MIR_reg_t hard_reg;
  MIR_op_mode_t data_mode;
  MIR_type_t type;
  MIR_op_t mem_op;
  MIR_reg_t mem_loc;
  MIR_context_t ctx;
  int restore_p_local;
  int after_p_local;
  MIR_insn_t anchor_local;
  MIR_reg_t base_reg_local;
  MIR_reg_t reg_local;
  gen_ctx_t gen_ctx_local;
  
  type_00 = MIR_reg_type(gen_ctx->ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
  data_mode_00 = type2mode(type_00);
  hard_reg_00 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)reg);
  if (hard_reg_00 < 0x22) {
    mem_op.u.mem.disp._4_4_ = get_spill_mem_loc(gen_ctx,reg);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pcVar1 = "Spill";
      if (restore_p != 0) {
        pcVar1 = "Restore";
      }
      fprintf((FILE *)gen_ctx->debug_file,"    %s r%d:",pcVar1,(ulong)reg);
    }
    add_ld_st(gen_ctx,(MIR_op_t *)&data_mode,mem_op.u.mem.disp._4_4_,base_reg,data_mode_00,
              hard_reg_00,(uint)((restore_p != 0 ^ 0xffU) & 1),10,anchor,after_p);
    return;
  }
  __assert_fail("hard_reg <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1eb0,
                "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)");
}

Assistant:

static void spill_restore_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, MIR_reg_t base_reg,
                               MIR_insn_t anchor, int after_p, int restore_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t mem_loc;
  MIR_op_t mem_op;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_op_mode_t data_mode = type2mode (type);
  MIR_reg_t hard_reg = VARR_GET (MIR_reg_t, reg_renumber, reg);
  gen_assert (hard_reg <= MAX_HARD_REG);
  mem_loc = get_spill_mem_loc (gen_ctx, reg);
  DEBUG (2, { fprintf (debug_file, "    %s r%d:", restore_p ? "Restore" : "Spill", reg); });
  add_ld_st (gen_ctx, &mem_op, mem_loc, base_reg, data_mode, hard_reg, !restore_p,
             TEMP_INT_HARD_REG1, anchor, after_p);
}